

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall
higan::HttpServer::OnNewMessage(HttpServer *this,TcpConnectionPtr *connection,Buffer *buffer)

{
  TcpConnection *pTVar1;
  bool bVar2;
  any *__any;
  HttpContext *this_00;
  HttpRequest *request;
  string local_50;
  allocator<char> local_29;
  
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"HttpContext",&local_29);
  __any = TcpConnection::GetContext(pTVar1,&local_50);
  this_00 = std::any_cast<higan::HttpContext>(__any);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = HttpContext::ParseRequest(this_00,buffer);
  if (!bVar2) {
    pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"HTTP/1.1 400 Bad Request\r\n\r\n",&local_29);
    TcpConnection::Send(pTVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    TcpConnection::DestroyConnection
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
  }
  bVar2 = HttpContext::ParseOver(this_00);
  if (bVar2) {
    request = HttpContext::GetRequest(this_00);
    OnHttpRequest(this,connection,request);
    HttpContext::Reset(this_00);
  }
  return;
}

Assistant:

void HttpServer::OnNewMessage(const TcpConnectionPtr& connection, Buffer* buffer)
{
	HttpContext* context =
			std::any_cast<HttpContext>(connection->GetContext("HttpContext"));

	bool parse_ok = context->ParseRequest(buffer);

	if (!parse_ok)
	{
		/**
		 * 解析失败直接简单粗暴返回错误 .... 可以可以 不分配多余的资源
		 */
		connection->Send("HTTP/1.1 400 Bad Request\r\n\r\n");
		connection->DestroyConnection();
	}

	if (context->ParseOver())
	{
		OnHttpRequest(connection, context->GetRequest());
		context->Reset();
	}
}